

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O2

void __thiscall
google::anon_unknown_1::FlagValue::FlagValue
          (FlagValue *this,void *valbuf,char *type,bool transfer_ownership_of_value)

{
  int iVar1;
  char *__s2;
  char cVar2;
  
  this->value_buffer_ = valbuf;
  this->owns_value_ = transfer_ownership_of_value;
  cVar2 = '\0';
  do {
    this->type_ = cVar2;
    if ('\x06' < cVar2) {
LAB_00190907:
      __assert_fail("type_ <= FV_MAX_INDEX",
                    "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/gflags/src/gflags.cc"
                    ,0xfe,
                    "google::(anonymous namespace)::FlagValue::FlagValue(void *, const char *, bool)"
                   );
    }
    __s2 = TypeName(this);
    iVar1 = strcmp(type,__s2);
    if (iVar1 == 0) {
      if (this->type_ < '\a') {
        return;
      }
      goto LAB_00190907;
    }
    cVar2 = this->type_ + '\x01';
  } while( true );
}

Assistant:

FlagValue::FlagValue(void* valbuf, const char* type,
                     bool transfer_ownership_of_value)
    : value_buffer_(valbuf),
      owns_value_(transfer_ownership_of_value) {
  for (type_ = 0; type_ <= FV_MAX_INDEX; ++type_) {
    if (!strcmp(type, TypeName())) {
      break;
    }
  }
  assert(type_ <= FV_MAX_INDEX);  // Unknown typename
}